

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

bool goodform::json::deserialize(istream *input,any *v)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  double tmp;
  char drain [5];
  string str_number;
  string s;
  
  strip_white_space(input);
  bVar1 = std::istream::peek();
  if (bVar1 == 0x22) {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    bVar2 = read_string(input,&s);
    std::any::operator=(v,&s);
    std::__cxx11::string::~string((string *)&s);
    return bVar2;
  }
  if (bVar1 == 0x5b) {
    bVar2 = parse_array(input,v);
    return bVar2;
  }
  if (bVar1 == 0x7b) {
    bVar2 = parse_object(input,v);
    return bVar2;
  }
  if ((bVar1 == 0x2d) || ((int)(char)bVar1 - 0x30U < 10)) {
    str_number._M_dataplus._M_p = (pointer)&str_number.field_2;
    str_number._M_string_length = 0;
    str_number.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)&str_number);
    std::istream::seekg((long)input,_S_cur);
    bVar2 = false;
    bVar4 = false;
    while ((!bVar2 && (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0))) {
      bVar3 = std::istream::peek();
      bVar5 = bVar3 == 0x2e;
      bVar2 = 9 < (int)(char)bVar3 - 0x30U;
      bVar6 = (bVar3 & 0xdf) != 0x45;
      if ((bVar3 == 0x2b || bVar5) || ((bVar3 == 0x2d || !bVar6) || !bVar2)) {
        std::__cxx11::string::push_back((char)&str_number);
        std::istream::seekg((long)input,_S_cur);
      }
      bVar4 = (bool)(bVar4 | bVar5);
      bVar2 = (bVar3 != 0x2b && !bVar5) && ((bVar3 != 0x2d && bVar6) && bVar2);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&s,(string *)&str_number,_S_out|_S_in);
    if (bVar4) {
      std::istream::_M_extract<double>((double *)&s);
      std::any::operator=(v,&tmp);
    }
    else if (bVar1 == 0x2d) {
      std::istream::_M_extract<long>((long *)&s);
      std::any::operator=(v,(long *)&tmp);
    }
    else {
      std::istream::_M_extract<unsigned_long>((ulong *)&s);
      std::any::operator=(v,(unsigned_long *)&tmp);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&s);
    std::__cxx11::string::~string((string *)&str_number);
  }
  else {
    bVar1 = bVar1 & 0xdf;
    if (bVar1 == 0x46) {
      std::istream::read((char *)input,(long)drain);
      s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffffffffff00;
    }
    else {
      if (bVar1 == 0x4e) {
        std::istream::read((char *)input,(long)drain);
        s._M_dataplus._M_p = (pointer)0x0;
        std::any::operator=(v,(void **)&s);
        return true;
      }
      if (bVar1 != 0x54) {
        return false;
      }
      std::istream::read((char *)input,(long)drain);
      s._M_dataplus._M_p._0_1_ = 1;
    }
    std::any::operator=(v,(bool *)&s);
  }
  return true;
}

Assistant:

bool json::deserialize(std::istream& input, any& v)
  {
    bool ret = false;

    char drain[5];

    strip_white_space(input);

    char c = (char)input.peek();
    if (c == '{')
    {
      ret = parse_object(input, v);
    }
    else if (c == '[')
    {
      ret = parse_array(input, v);
    }
    else if (c == '"')
    {
      std::string s;
      ret = read_string(input, s);
      v = std::move(s);
    }
    else if (isdigit(c) || c == '-')
    {
      bool is_signed = (c == '-');

      std::string str_number;
      str_number += c;
      input.seekg(1, std::ios::cur);
      bool done = false;
      bool found_period = false;
      while (!done && input.good())
      {
        c = (char)input.peek();

        if (c == '.')
          found_period = true;

        if (isdigit(c) || c == '.' || c == 'e' || c == 'E' || c == '-' || c == '+')
        {
          str_number += c;
          input.seekg(1, std::ios::cur);
        }
        else
        {
          done = true;
        }
      }

      std::stringstream ss(str_number);
      if (found_period)
      {
        double tmp;
        ss >> tmp;
        v = (tmp);
      }
      else if (is_signed)
      {
        std::int64_t tmp;
        ss >> tmp;
        v = (tmp);
      }
      else
      {
        std::uint64_t tmp;
        ss >> tmp;
        v = (tmp);
      }

      ret = true;
    }
    else if (c == 't' || c == 'T')
    {
      input.read(drain, 4);
      v = (true);
      ret = true;
    }
    else if (c == 'f' || c == 'F')
    {
      input.read(drain, 5);
      v = (false);
      ret = true;
    }
    else if (c == 'n' || c == 'N')
    {
      input.read(drain, 4);
      v = (nullptr);
      ret = true;
    }

    return ret;
  }